

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_foreign(sexp ctx,char *name,int num_args,int flags,char *fname,sexp_proc1 f,sexp data
                      )

{
  sexp psVar1;
  byte in_CL;
  int in_EDX;
  long in_RDI;
  long in_R8;
  sexp in_R9;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  size_t size;
  sexp psVar2;
  int local_14;
  
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  size = *(size_t *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc0;
  psVar2 = sexp_alloc_tagged_aux(psVar2,size,(sexp_uint_t)&stack0xffffffffffffffd0);
  (psVar2->value).flonum_bits[0x58] = '\v';
  if (in_EDX < 5) {
    (psVar2->value).flonum_bits[0x59] = (char)in_EDX + '\a';
  }
  else {
    (psVar2->value).flonum_bits[0x59] = '\f';
  }
  local_14 = in_EDX;
  if ((in_CL & 1) != 0) {
    local_14 = in_EDX + -1;
  }
  (psVar2->value).flonum_bits[0x5a] = (char)local_14;
  (psVar2->value).opcode.flags = in_CL;
  psVar1 = sexp_c_string(in_R9,(char *)psVar2,size);
  (psVar2->value).type.name = psVar1;
  (psVar2->value).type.cpl = (sexp)__sexp_gc_preserver1.var;
  (psVar2->value).context.dl = in_R9;
  if (in_R8 != 0) {
    psVar1 = sexp_c_string(in_R9,(char *)psVar2,size);
    (psVar2->value).type.slots = psVar1;
  }
  (psVar2->value).opcode.dl = *(sexp *)(in_RDI + 0x68);
  *(size_t *)(in_RDI + 0x6080) = size;
  return psVar2;
}

Assistant:

sexp sexp_make_foreign (sexp ctx, const char *name, int num_args,
                        int flags, const char *fname, sexp_proc1 f, sexp data) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
#if ! SEXP_USE_EXTENDED_FCALL
  if (num_args > 4)
    return sexp_user_exception(ctx, NULL, "make-foreign: exceeded foreign arg limit",
                               sexp_make_fixnum(num_args));
#endif
  res = sexp_alloc_type(ctx, opcode, SEXP_OPCODE);
  sexp_opcode_class(res) = SEXP_OPC_FOREIGN;
#if SEXP_USE_EXTENDED_FCALL
  if (num_args > 4)
    sexp_opcode_code(res) = SEXP_OP_FCALLN;
  else
#endif
    sexp_opcode_code(res) = SEXP_OP_FCALL1+num_args-1;
  if (flags & 1) num_args--;
  sexp_opcode_num_args(res) = num_args;
  sexp_opcode_flags(res) = flags;
  sexp_opcode_name(res) = sexp_c_string(ctx, name, -1);
  sexp_opcode_data(res) = data;
  sexp_opcode_func(res) = f;
  if (fname) {
    sexp_opcode_data2(res) = sexp_c_string(ctx, fname, -1);
  }
#if SEXP_USE_DL
  sexp_opcode_dl(res) = sexp_context_dl(ctx);
#endif
  sexp_gc_release1(ctx);
  return res;
}